

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O0

bool __thiscall
OpenMesh::IO::_OMReader_::read_binary(_OMReader_ *this,istream *_is,BaseImporter *_bi,Options *_opt)

{
  bool bVar1;
  byte bVar2;
  Type TVar3;
  size_t sVar4;
  ulong uVar5;
  bool local_65;
  undefined1 local_58 [8];
  PropertyName pn;
  bool swap;
  Options *_opt_local;
  BaseImporter *_bi_local;
  istream *_is_local;
  _OMReader_ *this_local;
  
  bVar1 = Options::check(_opt,6);
  local_65 = true;
  if (!bVar1) {
    TVar3 = Endian::local();
    local_65 = TVar3 == MSB;
  }
  pn._31_1_ = local_65;
  this->bytes_ = 0;
  sVar4 = restore<OpenMesh::IO::OMFormat::Header>(_is,&this->header_,local_65);
  this->bytes_ = sVar4 + this->bytes_;
  while( true ) {
    bVar2 = std::ios::eof();
    if (((bVar2 ^ 0xff) & 1) == 0) {
      return true;
    }
    sVar4 = restore<OpenMesh::IO::OMFormat::Chunk::Header>
                      (_is,&this->chunk_header_,(bool)(pn._31_1_ & 1));
    this->bytes_ = sVar4 + this->bytes_;
    uVar5 = std::ios::eof();
    if ((uVar5 & 1) != 0) break;
    if (((uint)this->chunk_header_ >> 1 & 1) != 0) {
      OMFormat::Chunk::PropertyName::PropertyName((PropertyName *)local_58);
      sVar4 = restore<OpenMesh::IO::OMFormat::Chunk::PropertyName>
                        (_is,&this->property_name_,(bool)(pn._31_1_ & 1));
      this->bytes_ = sVar4 + this->bytes_;
      OMFormat::Chunk::PropertyName::~PropertyName((PropertyName *)local_58);
    }
    switch((uint)this->chunk_header_ >> 2 & 7) {
    case 0:
      bVar1 = read_binary_vertex_chunk(this,_is,_bi,_opt,(bool)(pn._31_1_ & 1));
      if (!bVar1) {
        return false;
      }
      break;
    case 1:
      bVar1 = read_binary_mesh_chunk(this,_is,_bi,_opt,(bool)(pn._31_1_ & 1));
      if (!bVar1) {
        return false;
      }
      break;
    case 2:
      bVar1 = read_binary_face_chunk(this,_is,_bi,_opt,(bool)(pn._31_1_ & 1));
      if (!bVar1) {
        return false;
      }
      break;
    default:
      return false;
    case 4:
      bVar1 = read_binary_edge_chunk(this,_is,_bi,_opt,(bool)(pn._31_1_ & 1));
      if (!bVar1) {
        return false;
      }
      break;
    case 6:
      bVar1 = read_binary_halfedge_chunk(this,_is,_bi,_opt,(bool)(pn._31_1_ & 1));
      if (!bVar1) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool _OMReader_::read_binary(std::istream& _is, BaseImporter& _bi, Options& _opt) const
{
  bool swap = _opt.check(Options::Swap) || (Endian::local() == Endian::MSB);

  // Initialize byte counter
  bytes_ = 0;

  bytes_ += restore(_is, header_, swap);


  while (!_is.eof()) {
    bytes_ += restore(_is, chunk_header_, swap);

    if (_is.eof())
      break;

    // Is this a named property restore the name
    if (chunk_header_.name_) {
      OMFormat::Chunk::PropertyName pn;
      bytes_ += restore(_is, property_name_, swap);
    }

    // Read in the property data. If it is an anonymous or unknown named
    // property, then skip data.
    switch (chunk_header_.entity_) {
      case OMFormat::Chunk::Entity_Vertex:
        if (!read_binary_vertex_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Face:
        if (!read_binary_face_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Edge:
        if (!read_binary_edge_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Halfedge:
        if (!read_binary_halfedge_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      case OMFormat::Chunk::Entity_Mesh:
        if (!read_binary_mesh_chunk(_is, _bi, _opt, swap))
          return false;
        break;
      default:
        return false;
    }

  }

  // File was successfully parsed.
  return true;
}